

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O1

LocalizedNumberFormatter * __thiscall
icu_63::number::NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>::adoptPerUnit
          (LocalizedNumberFormatter *__return_storage_ptr__,
          NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter> *this,
          MeasureUnit *perUnit)

{
  impl::MacroProps::MacroProps((MacroProps *)__return_storage_ptr__,&this->fMacros);
  __return_storage_ptr__->fCompiled = (NumberFormatterImpl *)0x0;
  __return_storage_ptr__->fUnsafeCallCount[0] = '\0';
  __return_storage_ptr__->fUnsafeCallCount[1] = '\0';
  __return_storage_ptr__->fUnsafeCallCount[2] = '\0';
  __return_storage_ptr__->fUnsafeCallCount[3] = '\0';
  __return_storage_ptr__->fUnsafeCallCount[4] = '\0';
  __return_storage_ptr__->fUnsafeCallCount[5] = '\0';
  __return_storage_ptr__->fUnsafeCallCount[6] = '\0';
  __return_storage_ptr__->fUnsafeCallCount[7] = '\0';
  if (perUnit != (MeasureUnit *)0x0) {
    MeasureUnit::operator=
              (&(__return_storage_ptr__->
                super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
                perUnit,perUnit);
    (*(perUnit->super_UObject)._vptr_UObject[1])(perUnit);
  }
  return __return_storage_ptr__;
}

Assistant:

Derived NumberFormatterSettings<Derived>::adoptPerUnit(icu::MeasureUnit* perUnit) const& {
    Derived copy(*this);
    // See comments above about slicing and ownership.
    if (perUnit != nullptr) {
        // TODO: On nullptr, reset to default value?
        copy.fMacros.perUnit = std::move(*perUnit);
        delete perUnit;
    }
    return copy;
}